

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O2

void __thiscall
S2BooleanOperation::Impl::CrossingProcessor::AddCrossing
          (CrossingProcessor *this,SourceEdgeCrossing *crossing)

{
  pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_> local_10;
  
  local_10.first =
       *(int *)&(this->input_dimensions_->
                super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                super__Vector_impl_data._M_finish -
       *(int *)&(this->input_dimensions_->
                super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  local_10.second._4_8_ = *(undefined8 *)&(crossing->first).edge_id_;
  local_10.second.first._0_4_ = *(undefined4 *)&crossing->first;
  std::
  vector<std::pair<int,std::pair<S2BooleanOperation::SourceId,bool>>,std::allocator<std::pair<int,std::pair<S2BooleanOperation::SourceId,bool>>>>
  ::emplace_back<std::pair<int,std::pair<S2BooleanOperation::SourceId,bool>>>
            ((vector<std::pair<int,std::pair<S2BooleanOperation::SourceId,bool>>,std::allocator<std::pair<int,std::pair<S2BooleanOperation::SourceId,bool>>>>
              *)&this->source_edge_crossings_,&local_10);
  return;
}

Assistant:

void AddCrossing(const SourceEdgeCrossing& crossing) {
    source_edge_crossings_.push_back(make_pair(input_edge_id(), crossing));
  }